

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O0

void __thiscall
QItemSelection::merge(QItemSelection *this,QItemSelection *other,SelectionFlags command)

{
  bool bVar1;
  bool bVar2;
  const_iterator o;
  qsizetype qVar3;
  QList<QItemSelectionRange> *in_RSI;
  QList<QItemSelectionRange> *in_RDI;
  long in_FS_OFFSET;
  int n;
  int t_1;
  int i;
  int t;
  QItemSelectionRange *range;
  QItemSelection *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QItemSelection intersections;
  QItemSelection newSelection;
  undefined4 in_stack_fffffffffffffe88;
  SelectionFlag in_stack_fffffffffffffe8c;
  QItemSelectionRange *in_stack_fffffffffffffe90;
  const_reference in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  QItemSelectionRange *in_stack_fffffffffffffec8;
  QItemSelectionRange *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  bool local_d1;
  byte local_c1;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> local_80;
  QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> local_7c;
  QItemSelection *in_stack_ffffffffffffff88;
  QItemSelectionRange *in_stack_ffffffffffffff90;
  const_iterator range_00;
  const_iterator local_58;
  QList<QItemSelectionRange> local_50;
  QList<QItemSelectionRange> local_38;
  QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> local_18;
  QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> local_14;
  QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QList<QItemSelectionRange>::isEmpty((QList<QItemSelectionRange> *)0x825480);
  local_c1 = 1;
  if (!bVar1) {
    local_10.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
         (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
         QFlags<QItemSelectionModel::SelectionFlag>::operator&
                   ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffe90,
                    in_stack_fffffffffffffe8c);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_10);
    local_d1 = true;
    if (!bVar1) {
      local_14.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
           (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
           QFlags<QItemSelectionModel::SelectionFlag>::operator&
                     ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffe90,
                      in_stack_fffffffffffffe8c);
      bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_14);
      local_d1 = true;
      if (!bVar1) {
        local_18.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
             (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
             QFlags<QItemSelectionModel::SelectionFlag>::operator&
                       ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffe90,
                        in_stack_fffffffffffffe8c);
        local_d1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_18);
      }
    }
    local_c1 = local_d1 ^ 0xff;
  }
  if ((local_c1 & 1) == 0) {
    local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d.ptr = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QItemSelection((QItemSelection *)0x825585);
    QList<QItemSelectionRange>::size(in_RSI);
    QList<QItemSelectionRange>::reserve
              ((QList<QItemSelectionRange> *)
               CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
               CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    local_50.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_50.d.ptr = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
    local_50.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QItemSelection((QItemSelection *)0x8255de);
    local_58.i = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = QList<QItemSelectionRange>::begin(in_stack_fffffffffffffe90);
    o = QList<QItemSelectionRange>::end(in_stack_fffffffffffffe90);
    while (range_00 = o, bVar1 = QList<QItemSelectionRange>::const_iterator::operator!=(&local_58,o)
          , bVar1) {
      QList<QItemSelectionRange>::const_iterator::operator*(&local_58);
      bVar1 = QItemSelectionRange::isValid(in_stack_fffffffffffffea8);
      if (bVar1) {
        QList<QItemSelectionRange>::push_back
                  ((QList<QItemSelectionRange> *)in_stack_fffffffffffffe90,
                   (parameter_type)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        for (local_b4 = 0; qVar3 = QList<QItemSelectionRange>::size(in_RDI), local_b4 < qVar3;
            local_b4 = local_b4 + 1) {
          QList<QItemSelectionRange>::at
                    ((QList<QItemSelectionRange> *)in_stack_fffffffffffffe90,
                     CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          bVar1 = QItemSelectionRange::intersects
                            ((QItemSelectionRange *)
                             CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                             in_stack_fffffffffffffea8);
          if (bVar1) {
            QList<QItemSelectionRange>::at
                      ((QList<QItemSelectionRange> *)in_stack_fffffffffffffe90,
                       CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
            QItemSelectionRange::intersected(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
            QList<QItemSelectionRange>::append
                      ((QList<QItemSelectionRange> *)in_stack_fffffffffffffe90,
                       (rvalue_ref)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
            QItemSelectionRange::~QItemSelectionRange(in_stack_fffffffffffffe90);
          }
        }
      }
      QList<QItemSelectionRange>::const_iterator::operator++(&local_58);
    }
    for (local_b8 = 0; qVar3 = QList<QItemSelectionRange>::size(&local_50), local_b8 < qVar3;
        local_b8 = local_b8 + 1) {
      local_bc = 0;
      while (qVar3 = QList<QItemSelectionRange>::size(in_RDI), local_bc < qVar3) {
        QList<QItemSelectionRange>::at
                  ((QList<QItemSelectionRange> *)in_stack_fffffffffffffe90,
                   CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        QList<QItemSelectionRange>::at
                  ((QList<QItemSelectionRange> *)in_stack_fffffffffffffe90,
                   CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        bVar1 = QItemSelectionRange::intersects
                          ((QItemSelectionRange *)
                           CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                           in_stack_fffffffffffffea8);
        if (bVar1) {
          QList<QItemSelectionRange>::at
                    ((QList<QItemSelectionRange> *)in_stack_fffffffffffffe90,
                     CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          QList<QItemSelectionRange>::at
                    ((QList<QItemSelectionRange> *)in_stack_fffffffffffffe90,
                     CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          split(range_00.i,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
          QList<QItemSelectionRange>::removeAt
                    ((QList<QItemSelectionRange> *)in_stack_fffffffffffffe90,
                     CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        }
        else {
          local_bc = local_bc + 1;
        }
      }
      local_c0 = 0;
      while( true ) {
        local_7c.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
             (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
             QFlags<QItemSelectionModel::SelectionFlag>::operator&
                       ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffe90,
                        in_stack_fffffffffffffe8c);
        bVar2 = ::QFlags::operator_cast_to_bool((QFlags *)&local_7c);
        bVar1 = false;
        if (bVar2) {
          qVar3 = QList<QItemSelectionRange>::size(&local_38);
          bVar1 = local_c0 < qVar3;
        }
        if (!bVar1) break;
        in_stack_fffffffffffffea8 =
             QList<QItemSelectionRange>::at
                       ((QList<QItemSelectionRange> *)in_stack_fffffffffffffe90,
                        CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        QList<QItemSelectionRange>::at
                  ((QList<QItemSelectionRange> *)in_stack_fffffffffffffe90,
                   CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        in_stack_fffffffffffffeb7 =
             QItemSelectionRange::intersects
                       ((QItemSelectionRange *)
                        CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                        in_stack_fffffffffffffea8);
        if ((bool)in_stack_fffffffffffffeb7) {
          QList<QItemSelectionRange>::at
                    ((QList<QItemSelectionRange> *)in_stack_fffffffffffffe90,
                     CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          QList<QItemSelectionRange>::at
                    ((QList<QItemSelectionRange> *)in_stack_fffffffffffffe90,
                     CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          split(range_00.i,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
          QList<QItemSelectionRange>::removeAt
                    ((QList<QItemSelectionRange> *)in_stack_fffffffffffffe90,
                     CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        }
        else {
          local_c0 = local_c0 + 1;
        }
      }
    }
    local_80.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
         (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
         QFlags<QItemSelectionModel::SelectionFlag>::operator&
                   ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffe90,
                    in_stack_fffffffffffffe8c);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_80);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      QList<QItemSelectionRange>::operator+=
                ((QList<QItemSelectionRange> *)in_stack_fffffffffffffe90,
                 (QList<QItemSelectionRange> *)
                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    }
    ~QItemSelection((QItemSelection *)0x825b2f);
    ~QItemSelection((QItemSelection *)0x825b3c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QItemSelection::merge(const QItemSelection &other, QItemSelectionModel::SelectionFlags command)
{
    if (other.isEmpty() ||
          !(command & QItemSelectionModel::Select ||
          command & QItemSelectionModel::Deselect ||
          command & QItemSelectionModel::Toggle))
        return;

    QItemSelection newSelection;
    newSelection.reserve(other.size());
    // Collect intersections
    QItemSelection intersections;
    for (const auto &range : other) {
        if (!range.isValid())
            continue;
        newSelection.push_back(range);
        for (int t = 0; t < size(); ++t) {
            if (range.intersects(at(t)))
                intersections.append(at(t).intersected(range));
        }
    }

    //  Split the old (and new) ranges using the intersections
    for (int i = 0; i < intersections.size(); ++i) { // for each intersection
        for (int t = 0; t < size();) { // splitt each old range
            if (at(t).intersects(intersections.at(i))) {
                split(at(t), intersections.at(i), this);
                removeAt(t);
            } else {
                ++t;
            }
        }
        // only split newSelection if Toggle is specified
        for (int n = 0; (command & QItemSelectionModel::Toggle) && n < newSelection.size();) {
            if (newSelection.at(n).intersects(intersections.at(i))) {
                split(newSelection.at(n), intersections.at(i), &newSelection);
                newSelection.removeAt(n);
            } else {
                ++n;
            }
        }
    }
    // do not add newSelection for Deselect
    if (!(command & QItemSelectionModel::Deselect))
        operator+=(newSelection);
}